

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O1

int arkSetMinStep(void *arkode_mem,realtype hmin)

{
  int iVar1;
  int error_code;
  char *msgfmt;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    iVar1 = -0x15;
    arkode_mem = (ARKodeMem)0x0;
    error_code = -0x15;
LAB_004ee141:
    arkProcessError((ARKodeMem)arkode_mem,error_code,"ARKode","arkSetMinStep",msgfmt);
  }
  else {
    if (hmin <= 0.0) {
      *(undefined8 *)((long)arkode_mem + 0x170) = 0;
    }
    else {
      if (1.0 < *(double *)((long)arkode_mem + 0x178) * hmin) {
        msgfmt = "Inconsistent step size limits: hmin > hmax.";
        iVar1 = -0x16;
        error_code = -0x16;
        goto LAB_004ee141;
      }
      *(realtype *)((long)arkode_mem + 0x170) = hmin;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int arkSetMinStep(void *arkode_mem, realtype hmin)
{
  ARKodeMem ark_mem;
  if (arkode_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkSetMinStep", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;

  /* Passing a value <= 0 sets hmin = 0 */
  if (hmin <= ZERO) {
    ark_mem->hmin = ZERO;
    return(ARK_SUCCESS);
  }

  /* check that hmin and hmax are agreeable */
  if (hmin * ark_mem->hmax_inv > ONE) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode",
                    "arkSetMinStep", MSG_ARK_BAD_HMIN_HMAX);
    return(ARK_ILL_INPUT);
  }

  /* set the value */
  ark_mem->hmin = hmin;

  return(ARK_SUCCESS);
}